

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_password.cpp
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  istream *piVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  string tmp;
  size_t k;
  size_t m;
  size_t n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hashed_password;
  key_type local_c0;
  size_type local_a0;
  ulong local_98;
  ulong local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1051b0) = 0;
  piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,local_a0,(allocator_type *)&local_68);
  if (local_a0 != 0) {
    uVar7 = 0;
    do {
      std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_a0);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (local_90 != 0) {
    uVar7 = 0;
    do {
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::operator>>((istream *)&std::cin,(string *)&local_c0);
      local_70 = &local_68;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&local_c0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_90);
  }
  if (local_98 != 0) {
    uVar7 = 0;
    do {
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::operator>>((istream *)&std::cin,(string *)&local_c0);
      if (local_a0 != 0) {
        uVar5 = 0;
        do {
          uVar4 = (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5] +
                  (long)local_c0._M_dataplus._M_p[uVar5]) - 0x61;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar4;
          local_c0._M_dataplus._M_p[uVar5] =
               (char)uVar4 + (char)(SUB164(auVar1 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 3) * -0x1a +
               'a';
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_a0);
      }
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&local_68,&local_c0);
      pcVar6 = "Match\n";
      if (iVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pcVar6 = "Unknown\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar6,
                 (ulong)(iVar3.
                         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ._M_cur == (__node_type *)0x0) * 2 + 6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_98);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    std::ios::sync_with_stdio(false);
    std::cin.tie(nullptr);
    size_t n, m, k;
    cin >> n >> m >> k;
    vector<size_t> v(k);
    for (size_t i = 0; i < k; ++i) {
        cin >> v[i];
    }
    unordered_set<string> hashed_password;
    for (size_t i = 0; i < n; ++i) {
        string tmp;
        cin >> tmp;
        hashed_password.insert(tmp);
    }
    for (int i = 0; i < m; ++i) {
        string tmp;
        cin >> tmp;
        for (int j = 0; j < k; ++j) {
            tmp[j] = (tmp[j] + v[j] - 'a') % 26 + 'a';
        }
        cout << ((hashed_password.find(tmp) != hashed_password.end())
                     ? "Match\n"
                     : "Unknown\n");
    }
}